

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O0

int __thiscall SocketOnline::recv_message_int(SocketOnline *this)

{
  int iVar1;
  undefined8 in_RDI;
  SocketOnline *unaff_retaddr;
  int ret;
  char *p;
  int in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  
  recv_message_n(unaff_retaddr,(SOCK)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffff0,
                 in_stack_ffffffffffffffec);
  iVar1 = Constant::Util::char_to_int((char **)&stack0xfffffffffffffff0);
  return iVar1;
}

Assistant:

int SocketOnline::recv_message_int() {
    recv_message_n(sock, buffer, 4);
    char* p = buffer;
    int ret = Constant::Util::char_to_int(p);
    return ret;
}